

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_lpf_reinit__internal(ma_lpf_config *pConfig,void *pHeap,ma_lpf *pLPF,ma_bool32 isNew)

{
  ma_format mVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  undefined4 uVar7;
  ma_lpf1 *pmVar4;
  ma_lpf2 *pmVar5;
  void *__ptr;
  int iVar8;
  ma_uint32 mVar9;
  uint uVar10;
  ma_result mVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  ma_lpf1_config config;
  ma_lpf_heap_layout heapLayout;
  ma_lpf1_config local_78;
  undefined1 local_58 [16];
  size_t local_48;
  ulong local_40;
  double local_38;
  
  if (pConfig == (ma_lpf_config *)0x0 || pLPF == (ma_lpf *)0x0) {
    return MA_INVALID_ARGS;
  }
  mVar1 = pConfig->format;
  if ((mVar1 != ma_format_f32) && (mVar1 != ma_format_s16)) {
    return MA_INVALID_ARGS;
  }
  if ((pLPF->format == ma_format_unknown || pLPF->format == mVar1) &&
     ((pLPF->channels == 0 || (pLPF->channels == pConfig->channels)))) {
    uVar12 = pConfig->order;
    if (8 < uVar12) {
      return MA_INVALID_ARGS;
    }
    uVar10 = uVar12 & 1;
    uVar13 = uVar12 >> 1;
    if (isNew == 0) {
      if (pLPF->lpf1Count != uVar10) goto LAB_00159336;
      if (pLPF->lpf2Count != uVar13) {
        return MA_INVALID_OPERATION;
      }
      local_58 = (undefined1  [16])0x0;
      local_48 = 0;
      local_58._8_8_ = 0;
    }
    else {
      mVar11 = ma_lpf_get_heap_layout(pConfig,(ma_lpf_heap_layout *)local_58);
      if (mVar11 != MA_SUCCESS) {
        return mVar11;
      }
      pLPF->_pHeap = pHeap;
      if (local_58._0_8_ != 0 && pHeap != (void *)0x0) {
        memset(pHeap,0,local_58._0_8_);
      }
      pLPF->pLPF1 = (ma_lpf1 *)((long)pHeap + local_58._8_8_);
      pLPF->pLPF2 = (ma_lpf2 *)(local_48 + (long)pHeap);
    }
    if (uVar10 != 0) {
      local_78.format = pConfig->format;
      local_78.cutoffFrequency = pConfig->cutoffFrequency;
      local_78._12_4_ = 0;
      uVar2 = pConfig->channels;
      uVar6 = pConfig->sampleRate;
      local_78.q = 0.5;
      local_78.channels = uVar2;
      local_78.sampleRate = uVar6;
      if (isNew == 0) {
        mVar11 = ma_lpf1_reinit(&local_78,pLPF->pLPF1);
      }
      else {
        if (uVar2 == 0) {
          return MA_INVALID_ARGS;
        }
        mVar11 = ma_lpf1_init_preallocated
                           (&local_78,(void *)((long)pHeap + local_58._8_8_ + (ulong)uVar10 * 0x28),
                            pLPF->pLPF1);
      }
      if (mVar11 != MA_SUCCESS) {
        return mVar11;
      }
    }
    if (1 < uVar12) {
      uVar14 = 0;
      local_40 = (ulong)uVar13;
      do {
        iVar8 = (int)uVar14;
        if (uVar10 == 0) {
          iVar8 = iVar8 * 2;
          uVar12 = pConfig->order * 2;
        }
        else {
          uVar12 = pConfig->order;
        }
        dVar17 = sin((-3.141592653589793 / (double)uVar12) * (double)(iVar8 + 1) +
                     1.5707963267948966);
        dVar17 = 1.0 / (dVar17 + dVar17);
        local_78.sampleRate = pConfig->sampleRate;
        local_78.cutoffFrequency = pConfig->cutoffFrequency;
        uVar16 = -(ulong)(dVar17 == 0.0);
        local_78.q = (double)(uVar16 & 0x3fe6a09edbf8b9bb | ~uVar16 & (ulong)dVar17);
        uVar3 = pConfig->format;
        uVar7 = pConfig->channels;
        local_78._12_4_ = 0;
        local_78.format = uVar3;
        local_78.channels = uVar7;
        if (isNew == 0) {
          mVar11 = ma_lpf2_reinit(&local_78,pLPF->pLPF2 + uVar14);
        }
        else {
          local_38 = (local_78.cutoffFrequency * 6.283185307179586) / (double)local_78.sampleRate;
          sin(local_38);
          sin(1.5707963267948966 - local_38);
          if ((ulong)local_78.channels == 0) {
            mVar11 = MA_INVALID_ARGS;
            goto LAB_0015950a;
          }
          mVar11 = ma_lpf2_init_preallocated
                             (&local_78,
                              (void *)((long)pHeap +
                                      local_78.channels * uVar14 * 8 +
                                      local_48 + (ulong)uVar13 * 0x40),pLPF->pLPF2 + uVar14);
        }
        if (mVar11 != MA_SUCCESS) {
LAB_0015950a:
          if ((((uVar10 != 0) && (pmVar4 = pLPF->pLPF1, pmVar4 != (ma_lpf1 *)0x0)) &&
              (pmVar4->_ownsHeap != 0)) && (pmVar4->_pHeap != (void *)0x0)) {
            free(pmVar4->_pHeap);
          }
          if (uVar14 == 0) {
            return mVar11;
          }
          lVar15 = 0x38;
          do {
            pmVar5 = pLPF->pLPF2;
            if (((pmVar5 != (ma_lpf2 *)0x0) && (*(int *)((long)&(pmVar5->bq).format + lVar15) != 0))
               && (__ptr = *(void **)((long)pmVar5 + lVar15 + -8), __ptr != (void *)0x0)) {
              free(__ptr);
            }
            lVar15 = lVar15 + 0x40;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
          return mVar11;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_40);
    }
    pLPF->lpf1Count = uVar10;
    pLPF->lpf2Count = uVar13;
    mVar9 = pConfig->channels;
    pLPF->format = pConfig->format;
    pLPF->channels = mVar9;
    pLPF->sampleRate = pConfig->sampleRate;
    mVar11 = MA_SUCCESS;
  }
  else {
LAB_00159336:
    mVar11 = MA_INVALID_OPERATION;
  }
  return mVar11;
}

Assistant:

static ma_result ma_lpf_reinit__internal(const ma_lpf_config* pConfig, void* pHeap, ma_lpf* pLPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;
    ma_lpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pLPF->format != ma_format_unknown && pLPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pLPF->channels != 0 && pLPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pLPF->lpf1Count != lpf1Count || pLPF->lpf2Count != lpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_lpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pLPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pLPF->pLPF1 = (ma_lpf1*)ma_offset_ptr(pHeap, heapLayout.lpf1Offset);
        pLPF->pLPF2 = (ma_lpf2*)ma_offset_ptr(pHeap, heapLayout.lpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);    /* To silence a compiler warning. */
    }

    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        if (isNew) {
            size_t lpf1HeapSizeInBytes;

            result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf1_init_preallocated(&lpf1Config, ma_offset_ptr(pHeap, heapLayout.lpf1Offset + (sizeof(ma_lpf1) * lpf1Count) + (ilpf1 * lpf1HeapSizeInBytes)), &pLPF->pLPF1[ilpf1]);
            }
        } else {
            result = ma_lpf1_reinit(&lpf1Config, &pLPF->pLPF1[ilpf1]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;

            for (jlpf1 = 0; jlpf1 < ilpf1; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        ma_lpf2_config lpf2Config;
        double q;
        double a;

        /* Tempting to use 0.707107, but won't result in a Butterworth filter if the order is > 2. */
        if (lpf1Count == 1) {
            a = (1 + ilpf2*1) * (MA_PI_D/(pConfig->order*1));   /* Odd order. */
        } else {
            a = (1 + ilpf2*2) * (MA_PI_D/(pConfig->order*2));   /* Even order. */
        }
        q = 1 / (2*ma_cosd(a));

        lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t lpf2HeapSizeInBytes;

            result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf2_init_preallocated(&lpf2Config, ma_offset_ptr(pHeap, heapLayout.lpf2Offset + (sizeof(ma_lpf2) * lpf2Count) + (ilpf2 * lpf2HeapSizeInBytes)), &pLPF->pLPF2[ilpf2]);
            }
        } else {
            result = ma_lpf2_reinit(&lpf2Config, &pLPF->pLPF2[ilpf2]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;
            ma_uint32 jlpf2;

            for (jlpf1 = 0; jlpf1 < lpf1Count; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            for (jlpf2 = 0; jlpf2 < ilpf2; jlpf2 += 1) {
                ma_lpf2_uninit(&pLPF->pLPF2[jlpf2], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    pLPF->lpf1Count  = lpf1Count;
    pLPF->lpf2Count  = lpf2Count;
    pLPF->format     = pConfig->format;
    pLPF->channels   = pConfig->channels;
    pLPF->sampleRate = pConfig->sampleRate;

    return MA_SUCCESS;
}